

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

Token * identifier(void)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  Token *in_RDI;
  Keyword *local_20;
  Keyword *keyword;
  size_t length;
  TokenType type;
  
  while( true ) {
    bVar1 = peek();
    bVar1 = isAlphaNumeric(bVar1);
    if (!bVar1) break;
    advance();
  }
  length._4_4_ = TOKEN_IDENTIFIER;
  __n = (long)scanner.current - (long)scanner.tokenStart;
  local_20 = keywords;
  do {
    if (local_20->name == (char *)0x0) {
LAB_00103d0f:
      makeToken(in_RDI,length._4_4_);
      return in_RDI;
    }
    if (__n == local_20->length) {
      iVar2 = memcmp(scanner.tokenStart,local_20->name,__n);
      if (iVar2 == 0) {
        length._4_4_ = local_20->type;
        goto LAB_00103d0f;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static Token identifier() {
    while (isAlphaNumeric(peek())) advance();

    TokenType type = TOKEN_IDENTIFIER;

    // See if the identifier is a reserved word.
    size_t length = scanner.current - scanner.tokenStart;
    Keyword *keyword;
    for (keyword = keywords; keyword->name != NULL; keyword++) {
        if (length == keyword->length &&
                memcmp(scanner.tokenStart, keyword->name, length) == 0) {
            type = keyword->type;
            break;
        }
    }

    return makeToken(type);
}